

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

void ImPlot::EndPlot(void)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar5;
  float fVar6;
  float fVar7;
  double dVar4;
  undefined1 uVar8;
  undefined1 uVar9;
  uint uVar10;
  ImPlotPlot *pIVar11;
  undefined8 *puVar12;
  ImVec4 *pIVar13;
  ImPlotContext *pIVar14;
  ImDrawList *pIVar15;
  ImRect *clip_rect_min;
  byte bVar16;
  bool bVar17;
  bool bVar18;
  int c;
  uint uVar19;
  ImU32 IVar20;
  ImU32 IVar21;
  int iVar22;
  ImPlotAnnotationCollection *pIVar23;
  ImVec4 *pIVar24;
  char *pcVar25;
  ulong uVar26;
  ImPlotPlot *pIVar27;
  ImPlotTick *pIVar28;
  ImVec2 *pIVar29;
  double *pdVar30;
  ImPlotPlot *pIVar31;
  ImPlotTick *pIVar32;
  float *pfVar33;
  int iVar34;
  long lVar35;
  bool *pbVar36;
  ImPlotAxis *this;
  char cVar37;
  int i_2;
  ImRect *pIVar38;
  ulong uVar39;
  ImPlotAxis *pIVar40;
  undefined8 in_R9;
  ImPlotAnnotation *pIVar41;
  char (*pacVar42) [16];
  int i;
  ImPlotTickCollection *pIVar43;
  long lVar44;
  long lVar45;
  ImPlotPlot *plot;
  ImVec2 IVar46;
  double dVar47;
  ImVec2 IVar48;
  double dVar49;
  ImPlotDateTimeFmt fmt;
  ImRect rect;
  ImVec2 h3;
  ImVec2 h4;
  ImVec2 v1;
  ImVec2 start;
  ImVec2 v3;
  ImVec2 v4;
  ImVec2 v2;
  undefined1 local_198 [8];
  ImVec2 aIStack_190 [2];
  undefined1 local_180 [8];
  undefined8 local_178;
  ImPlotAxis *local_170;
  ImVec2 *local_168;
  undefined8 uStack_160;
  ImDrawList *local_158;
  undefined8 uStack_150;
  ImPlotPlot *local_140;
  undefined8 local_138;
  float fStack_130;
  float fStack_12c;
  ImGuiIO *local_128;
  ImVec2 local_120;
  ImRect *local_118;
  ImPlotAnnotationCollection *local_110;
  ImVec2 local_108;
  ImPlotTickCollection *local_100;
  ImVec4 local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  ImVec2 *local_70;
  ImRect *local_68;
  ImVec2 *local_60;
  ImPlotAnnotationCollection *local_58;
  ImVec2 *local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar14 = GImPlot;
  if (GImPlot == (ImPlotContext *)0x0) {
    __assert_fail("(GImPlot != __null) && \"No current context. Did you call ImPlot::CreateContext() or ImPlot::SetCurrentContext()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0x8b6,"void ImPlot::EndPlot()");
  }
  pIVar11 = GImPlot->CurrentPlot;
  if (pIVar11 == (ImPlotPlot *)0x0) {
    __assert_fail("(gp.CurrentPlot != __null) && \"Mismatched BeginPlot()/EndPlot()!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0x8b8,"void ImPlot::EndPlot()");
  }
  local_158 = GImGui->CurrentWindow->DrawList;
  local_128 = ImGui::GetIO();
  bVar16 = 1;
  if ((pIVar11->YAxis[0].Dragging == false) && (pIVar11->YAxis[1].Dragging == false)) {
    bVar16 = pIVar11->YAxis[2].Dragging;
  }
  PushPlotClipRect((float)(-(uint)((pIVar14->Style).PlotBorderSize == 0.0) & 0x3f800000));
  if (((pIVar11->XAxis).Flags & 0x12U) == 0x10) {
    IVar20 = (pIVar11->XAxis).ColorMaj;
    RenderGridLinesX(local_158,&pIVar14->XTicks,&pIVar11->PlotRect,IVar20,IVar20,
                     (pIVar14->Style).MajorGridSize.x,(pIVar14->Style).MinorGridSize.x);
  }
  this = pIVar11->YAxis;
  local_170 = &pIVar11->XAxis;
  pIVar43 = pIVar14->YTicks;
  pIVar38 = &pIVar11->PlotRect;
  lVar35 = 0xf0;
  do {
    if ((*(char *)((long)pIVar11 + lVar35 + -0x3d) == '\x01') &&
       ((*(uint *)((long)pIVar11 + lVar35 + -0x60) & 0x12) == 0x10)) {
      RenderGridLinesY(local_158,pIVar43,pIVar38,*(ImU32 *)((long)pIVar11 + lVar35 + -4),
                       *(ImU32 *)((long)&pIVar11->ID + lVar35),(pIVar14->Style).MajorGridSize.y,
                       (pIVar14->Style).MinorGridSize.y);
    }
    pIVar43 = pIVar43 + 1;
    lVar35 = lVar35 + 0x80;
  } while (lVar35 != 0x270);
  local_140 = pIVar11;
  ImGui::PopClipRect();
  PushPlotClipRect(0.0);
  if (((local_170->Flags & 4) == 0) && (0 < (pIVar14->XTicks).Size)) {
    lVar35 = 8;
    lVar44 = 0;
    do {
      if ((pIVar14->XTicks).Ticks.Size <= lVar44) goto LAB_001b8a80;
      pIVar32 = (pIVar14->XTicks).Ticks.Data;
      if (*(int *)((long)&pIVar32->TextOffset + lVar35) == 0) {
        local_f8.y = (local_140->PlotRect).Max.y;
        local_f8.x = *(float *)((long)&pIVar32->PlotPos + lVar35);
        uVar19 = *(byte *)((long)&(pIVar32->LabelSize).y + lVar35) ^ 1;
        local_198._4_4_ = local_f8.y - ((ImVec2 *)((pIVar14->Style).Colors + -8))[uVar19].x;
        local_198._0_4_ = *(float *)((long)&pIVar32->PlotPos + lVar35);
        ImDrawList::AddLine(local_158,(ImVec2 *)&local_f8,(ImVec2 *)local_198,
                            (local_140->XAxis).ColorMaj,
                            ((ImVec2 *)((pIVar14->Style).Colors + -7))[uVar19].x);
      }
      lVar44 = lVar44 + 1;
      lVar35 = lVar35 + 0x20;
    } while (lVar44 < (pIVar14->XTicks).Size);
  }
  ImGui::PopClipRect();
  plot = local_140;
  local_68 = &local_140->FrameRect;
  local_70 = &(local_140->FrameRect).Max;
  local_60 = &(local_140->PlotRect).Max;
  local_f8.y = (local_140->PlotRect).Max.y;
  local_f8.x = (local_140->FrameRect).Max.x;
  local_118 = pIVar38;
  ImGui::PushClipRect(&pIVar38->Min,(ImVec2 *)&local_f8,true);
  local_100 = pIVar14->YTicks;
  local_50 = (ImVec2 *)&(pIVar14->Style).MajorTickLen.y;
  local_138 = (ImVec2 *)&(pIVar14->Style).MinorTickLen.y;
  local_58 = (ImPlotAnnotationCollection *)&(pIVar14->Style).MajorTickSize.y;
  local_110 = (ImPlotAnnotationCollection *)&(pIVar14->Style).MinorTickSize.y;
  lVar35 = 0;
  iVar22 = 0;
  do {
    iVar34 = iVar22;
    if (pIVar11->YAxis[lVar35].Present == true) {
      fVar2 = pIVar14->YAxisReference[lVar35];
      if (((this[lVar35].Flags & 4) == 0) && (0 < local_100[lVar35].Size)) {
        pIVar43 = local_100 + lVar35;
        lVar44 = 0x18;
        lVar45 = 0;
        local_168 = (ImVec2 *)CONCAT44(local_168._4_4_,fVar2);
        do {
          if ((pIVar43->Ticks).Size <= lVar45) goto LAB_001b8a80;
          pIVar32 = (pIVar43->Ticks).Data;
          local_f8.y = *(float *)((long)pIVar32 + lVar44 + -0x10);
          local_f8.x = fVar2;
          if ((1 < iVar22) ||
             (pIVar29 = local_50, *(char *)((long)&pIVar32->PlotPos + lVar44) == '\0')) {
            pIVar29 = local_138;
          }
          fVar6 = pIVar29->x;
          if (lVar35 != 0) {
            fVar6 = -fVar6;
          }
          local_198._4_4_ = local_f8.y + 0.0;
          local_198._0_4_ = fVar6 + fVar2;
          if ((1 < iVar22) ||
             (pIVar23 = local_58, *(char *)((long)&pIVar32->PlotPos + lVar44) == '\0')) {
            pIVar23 = local_110;
          }
          ImDrawList::AddLine(local_158,(ImVec2 *)&local_f8,(ImVec2 *)local_198,
                              this[lVar35].ColorMaj,(float)(pIVar23->Annotations).Size);
          lVar45 = lVar45 + 1;
          lVar44 = lVar44 + 0x20;
          fVar2 = local_168._0_4_;
        } while (lVar45 < pIVar43->Size);
      }
      plot = local_140;
      iVar34 = iVar22 + 1;
      if (1 < iVar22) {
        local_198._4_4_ = (local_140->PlotRect).Min.y;
        local_198._0_4_ = fVar2;
        local_180._4_4_ = (local_140->PlotRect).Max.y;
        local_180._0_4_ = fVar2;
        fVar2 = (GImPlot->Style).Colors[0x14].w;
        if ((fVar2 != -1.0) || (NAN(fVar2))) {
          local_f8.z = (GImPlot->Style).Colors[0x14].z;
          local_f8.w = (GImPlot->Style).Colors[0x14].w;
          pIVar24 = (GImPlot->Style).Colors + 0x14;
        }
        else {
          fVar2 = (GImPlot->Style).Colors[0x13].w;
          if ((fVar2 != -1.0) || (NAN(fVar2))) {
            pIVar24 = (GImPlot->Style).Colors + 0x13;
            pIVar13 = (GImPlot->Style).Colors + 0x13;
          }
          else {
            pIVar24 = ImGui::GetStyleColorVec4(0);
            pIVar13 = pIVar24;
          }
          uVar1 = pIVar13->z;
          uVar5 = pIVar13->w;
          local_f8.w = (float)uVar5 * 0.25;
          local_f8.z = (float)uVar1;
        }
        local_f8.x = pIVar24->x;
        local_f8.y = pIVar24->y;
        IVar20 = ImGui::ColorConvertFloat4ToU32(&local_f8);
        ImDrawList::AddLine(local_158,(ImVec2 *)local_198,(ImVec2 *)local_180,IVar20,1.0);
      }
    }
    lVar35 = lVar35 + 1;
    iVar22 = iVar34;
  } while (lVar35 != 3);
  ImGui::PopClipRect();
  PushPlotClipRect(0.0);
  if (0 < (pIVar14->Annotations).Size) {
    local_110 = &pIVar14->Annotations;
    lVar35 = 0;
    do {
      pIVar23 = local_110;
      pcVar25 = ImPlotAnnotationCollection::GetText(local_110,(int)lVar35);
      if ((pIVar23->Annotations).Size <= lVar35) {
        pcVar25 = "T &ImVector<ImPlotAnnotation>::operator[](int) [T = ImPlotAnnotation]";
        goto LAB_001b8a95;
      }
      pIVar41 = (pIVar14->Annotations).Annotations.Data;
      IVar46 = ImGui::CalcTextSize(pcVar25,(char *)0x0,false,-1.0);
      fVar2 = (pIVar14->Style).AnnotationPadding.x;
      fVar6 = fVar2 + fVar2 + IVar46.x;
      fVar3 = pIVar41[lVar35].Pos.x;
      fStack_130 = pIVar41[lVar35].Pos.y;
      fVar2 = pIVar41[lVar35].Offset.x;
      if ((fVar2 != 0.0) || (NAN(fVar2))) {
        if (0.0 < fVar2) goto LAB_001b728f;
        fVar2 = fVar3 - (fVar6 - fVar2);
      }
      else {
        fVar2 = fVar6 * -0.5;
LAB_001b728f:
        fVar2 = fVar2 + fVar3;
      }
      pIVar41 = pIVar41 + lVar35;
      fVar3 = (pIVar14->Style).AnnotationPadding.y;
      fVar7 = IVar46.y + fVar3 + fVar3;
      fVar3 = (pIVar41->Offset).y;
      if ((fVar3 != 0.0) || (NAN(fVar3))) {
        if (0.0 < fVar3) goto LAB_001b72d4;
        fStack_130 = fStack_130 - (fVar7 - fVar3);
      }
      else {
        fVar3 = fVar7 * -0.5;
LAB_001b72d4:
        fStack_130 = fStack_130 + fVar3;
      }
      if (pIVar41->Clamp == true) {
        fVar3 = (plot->PlotRect).Min.x;
        if (fVar2 < fVar3) {
          fVar2 = fVar3;
        }
        fVar3 = (plot->PlotRect).Min.y;
        if (fStack_130 < fVar3) {
          fStack_130 = fVar3;
        }
        fVar3 = (plot->PlotRect).Max.x;
        if (fVar3 < fVar6 + fVar2) {
          fVar2 = fVar3 - fVar6;
        }
        fVar3 = (plot->PlotRect).Max.y;
        if (fVar3 < fStack_130 + fVar7) {
          fStack_130 = fVar3 - fVar7;
        }
      }
      fVar6 = fVar6 + fVar2;
      local_138 = (ImVec2 *)CONCAT44(fStack_130,fStack_130);
      fVar7 = fVar7 + fStack_130;
      local_168 = (ImVec2 *)CONCAT44(fStack_130,fVar2);
      uStack_160 = 0;
      local_198._4_4_ = fStack_130;
      local_198._0_4_ = fVar2;
      aIStack_190[0].y = fVar7;
      aIStack_190[0].x = fVar6;
      fVar3 = (pIVar41->Offset).x;
      fStack_12c = fStack_130;
      if ((((fVar3 != 0.0) || (NAN(fVar3))) || (fVar3 = (pIVar41->Offset).y, fVar3 != 0.0)) ||
         (NAN(fVar3))) {
        local_f8.x = fVar2;
        local_f8.y = fStack_130;
        local_f8.z = fVar6;
        local_f8.w = fStack_130;
        local_e8 = CONCAT44(fVar7,fVar6);
        uStack_e0 = CONCAT44(fVar7,fVar2);
        uVar26 = 0;
        uVar39 = 0;
        fVar2 = 3.4028235e+38;
        do {
          fVar6 = (pIVar41->Pos).x - (&local_f8.x)[uVar26 * 2];
          fVar3 = (pIVar41->Pos).y - (&local_f8.y)[uVar26 * 2];
          fVar6 = fVar6 * fVar6 + fVar3 * fVar3;
          if (fVar6 < fVar2) {
            uVar39 = uVar26 & 0xffffffff;
            fVar2 = fVar6;
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 != 4);
        ImDrawList::AddLine(local_158,&pIVar41->Pos,(ImVec2 *)(&local_f8.x + (long)(int)uVar39 * 2),
                            pIVar41->ColorBg,1.0);
      }
      pIVar15 = local_158;
      ImDrawList::AddRectFilled(local_158,(ImVec2 *)local_198,aIStack_190,pIVar41->ColorBg,0.0,0);
      local_f8.x = local_168._0_4_ + (pIVar14->Style).AnnotationPadding.x;
      local_f8.y = (float)local_138 + (pIVar14->Style).AnnotationPadding.y;
      ImDrawList::AddText(pIVar15,(ImVec2 *)&local_f8,pIVar41->ColorFg,pcVar25,(char *)0x0);
      lVar35 = lVar35 + 1;
    } while (lVar35 < (pIVar14->Annotations).Size);
  }
  if (plot->Selected != false) {
    fVar2 = (plot->PlotRect).Min.x;
    fVar6 = (plot->PlotRect).Min.y;
    local_180._4_4_ = (plot->SelectRect).Min.y + fVar6;
    local_180._0_4_ = (plot->SelectRect).Min.x + fVar2;
    local_120.x = fVar2 + (plot->SelectRect).Max.x;
    local_120.y = fVar6 + (plot->SelectRect).Max.y;
    fVar2 = (GImPlot->Style).Colors[0x15].w;
    if ((fVar2 != -1.0) || (NAN(fVar2))) {
      fVar2 = (GImPlot->Style).Colors[0x15].x;
      fVar6 = (GImPlot->Style).Colors[0x15].y;
      aIStack_190[0].x = (GImPlot->Style).Colors[0x15].z;
      aIStack_190[0].y = (GImPlot->Style).Colors[0x15].w;
    }
    else {
      aIStack_190[0].x = 0.0;
      aIStack_190[0].y = 1.0;
      fVar2 = 1.0;
      fVar6 = 1.0;
    }
    local_198._4_4_ = fVar6;
    local_198._0_4_ = fVar2;
    local_f8.y = fVar6;
    local_f8.x = fVar2;
    local_f8.w = aIStack_190[0].y * 0.25;
    local_f8.z = aIStack_190[0].x;
    IVar20 = ImGui::GetColorU32(&local_f8);
    IVar21 = ImGui::GetColorU32((ImVec4 *)local_198);
    pIVar15 = local_158;
    ImDrawList::AddRectFilled(local_158,(ImVec2 *)local_180,&local_120,IVar20,0.0,0);
    ImDrawList::AddRect(pIVar15,(ImVec2 *)local_180,&local_120,IVar21,0.0,0,1.0);
  }
  if (plot->Queried == true) {
    fVar2 = (plot->PlotRect).Min.x;
    fVar6 = (plot->PlotRect).Min.y;
    local_180._4_4_ = (plot->QueryRect).Min.y + fVar6;
    local_180._0_4_ = (plot->QueryRect).Min.x + fVar2;
    local_120.x = fVar2 + (plot->QueryRect).Max.x;
    local_120.y = fVar6 + (plot->QueryRect).Max.y;
    fVar2 = (GImPlot->Style).Colors[0x16].w;
    if ((fVar2 != -1.0) || (NAN(fVar2))) {
      fVar3 = (GImPlot->Style).Colors[0x16].x;
      fVar7 = (GImPlot->Style).Colors[0x16].y;
      aIStack_190[0].x = (GImPlot->Style).Colors[0x16].z;
      aIStack_190[0].y = (GImPlot->Style).Colors[0x16].w;
    }
    else {
      fVar3 = 0.0;
      fVar7 = 1.0;
      aIStack_190[0].x = 0.0;
      aIStack_190[0].y = 1.0;
    }
    local_198._4_4_ = fVar7;
    local_198._0_4_ = fVar3;
    local_f8.y = fVar7;
    local_f8.x = fVar3;
    local_f8.w = aIStack_190[0].y * 0.25;
    local_f8.z = aIStack_190[0].x;
    IVar20 = ImGui::GetColorU32(&local_f8);
    IVar21 = ImGui::GetColorU32((ImVec4 *)local_198);
    pIVar15 = local_158;
    ImDrawList::AddRectFilled(local_158,(ImVec2 *)local_180,&local_120,IVar20,0.0,0);
    ImDrawList::AddRect(pIVar15,(ImVec2 *)local_180,&local_120,IVar21,0.0,0,1.0);
  }
  pIVar38 = local_118;
  if (((((plot->Flags & 0x800) != 0) && (plot->PlotHovered == true)) &&
      (((bVar16 | (plot->XAxis).Dragging) & 1) == 0)) &&
     (((plot->Selecting == false && (plot->Querying == false)) && (plot->LegendHovered == false))))
  {
    ImGui::SetMouseCursor(-1);
    local_48.x = (local_128->MousePos).x;
    local_f8.y = (local_128->MousePos).y;
    local_f8.x = (plot->PlotRect).Min.x;
    local_198._4_4_ = local_f8.y;
    local_198._0_4_ = local_48.x + -5.0;
    local_180._4_4_ = local_f8.y;
    local_180._0_4_ = local_48.x + 5.0;
    local_120.y = local_f8.y;
    local_120.x = (plot->PlotRect).Max.x;
    local_108.y = (plot->PlotRect).Min.y;
    local_108.x = local_48.x;
    local_38.y = local_f8.y + -5.0;
    local_48.y = local_f8.y + 5.0;
    local_40.y = (plot->PlotRect).Max.y;
    local_40.x = local_48.x;
    local_38.x = local_48.x;
    IVar20 = GetStyleColorU32(0x17);
    pIVar15 = local_158;
    ImDrawList::AddLine(local_158,(ImVec2 *)&local_f8,(ImVec2 *)local_198,IVar20,1.0);
    ImDrawList::AddLine(pIVar15,(ImVec2 *)local_180,&local_120,IVar20,1.0);
    ImDrawList::AddLine(pIVar15,&local_108,&local_38,IVar20,1.0);
    pIVar38 = local_118;
    ImDrawList::AddLine(pIVar15,&local_48,&local_40,IVar20,1.0);
  }
  if (((plot->Flags & 0x10) == 0) && (plot->PlotHovered == true)) {
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_f8.x = 0.0;
    local_f8.y = 0.0;
    local_f8.z = 0.0;
    local_f8.w = 0.0;
    local_180 = (undefined1  [8])&local_f8;
    local_178._0_4_ = 0x80;
    local_178._4_4_ = 0;
    if ((local_170->Flags & 0x40) == 0) {
      pcVar25 = (GImPlot->NextPlotData).FmtX;
      if ((GImPlot->NextPlotData).HasFmtX == false) {
        pcVar25 = "%g";
      }
      local_168 = (ImVec2 *)pIVar14->MousePos[0].x;
      if ((pIVar14->XTicks).Size < 2) {
        pIVar27 = (ImPlotPlot *)&(plot->XAxis).Range;
        pIVar31 = plot;
      }
      else {
        if ((pIVar14->XTicks).Ticks.Size < 2) goto LAB_001b8af4;
        pIVar27 = (ImPlotPlot *)(pIVar14->XTicks).Ticks.Data;
        pIVar31 = pIVar27;
      }
      dVar47 = (pIVar31->XAxis).Range.Max - *(double *)pIVar27;
      iVar22 = 0;
      if ((dVar47 != 0.0) || (NAN(dVar47))) {
        dVar47 = log10(ABS(dVar47));
        dVar47 = floor(dVar47);
        iVar22 = (int)dVar47;
      }
      iVar34 = 1 - iVar22;
      if (0 < iVar22) {
        iVar34 = 0;
      }
      local_138 = (ImVec2 *)pow(10.0,(double)iVar34);
      dVar47 = floor((double)local_168 * (double)local_138 + 0.5);
      ImBufferWriter::Write((ImBufferWriter *)local_180,pcVar25,dVar47 / (double)local_138);
    }
    else {
      pdVar30 = (double *)&GetUnitForRange(double)::cutoffs;
      uVar39 = 0;
      do {
        if (((plot->XAxis).Range.Max - (plot->XAxis).Range.Min) /
            (double)(((plot->PlotRect).Max.x - (plot->PlotRect).Min.x) / 100.0) <= *pdVar30)
        goto LAB_001b7a8f;
        uVar39 = uVar39 + 1;
        pdVar30 = pdVar30 + 1;
      } while (uVar39 != 8);
      uVar39 = 8;
LAB_001b7a8f:
      uVar26 = 7;
      if ((uint)uVar39 < 7) {
        uVar26 = uVar39 & 0xffffffff;
      }
      local_168 = (ImVec2 *)pIVar14->MousePos[0].x;
      lVar35 = (long)(double)local_168;
      dVar47 = floor((double)local_168);
      iVar22 = (int)((double)local_168 * 1000000.0 + dVar47 * -1000000.0);
      local_198 = (undefined1  [8])(lVar35 + iVar22 / 1000000);
      aIStack_190[0].x = (float)(iVar22 % 1000000);
      uVar8 = (GImPlot->Style).UseISO8601;
      uVar9 = (GImPlot->Style).Use24HourClock;
      fmt.Date._1_1_ = uVar9;
      fmt.Date._0_1_ = uVar8;
      fmt._2_6_ = 0;
      fmt._8_4_ = (undefined4)in_R9;
      iVar22 = FormatDateTime((ImPlot *)local_198,(ImPlotTime *)&local_f8,(char *)0x7f,
                              (int)*(undefined8 *)
                                    ((long)&TimeFormatMouseCursor + (uVar26 * 3 & 0xffffffff) * 4),
                              fmt);
      plot = local_140;
      if (0 < iVar22) {
        iVar34 = ~local_178._4_4_ + (int)local_178;
        if (iVar22 < (int)(~local_178._4_4_ + (int)local_178)) {
          iVar34 = iVar22;
        }
        local_178._4_4_ = iVar34 + local_178._4_4_;
      }
    }
    ImBufferWriter::Write((ImBufferWriter *)local_180,", ");
    pacVar42 = (GImPlot->NextPlotData).FmtY;
    if ((GImPlot->NextPlotData).HasFmtY[0] == false) {
      pacVar42 = (char (*) [16])0x35aec5;
    }
    local_168 = (ImVec2 *)pIVar14->MousePos[0].y;
    if (pIVar14->YTicks[0].Size < 2) {
      pIVar28 = (ImPlotTick *)&plot->YAxis[0].Range;
      pIVar32 = (ImPlotTick *)&plot->YAxis[0].Range.Max;
    }
    else {
      if (pIVar14->YTicks[0].Ticks.Size < 2) goto LAB_001b8af4;
      pIVar28 = pIVar14->YTicks[0].Ticks.Data;
      pIVar32 = pIVar28 + 1;
    }
    dVar47 = (double)pIVar32->PlotPos - pIVar28->PlotPos;
    iVar22 = 0;
    if ((dVar47 != 0.0) || (NAN(dVar47))) {
      dVar47 = log10(ABS(dVar47));
      dVar47 = floor(dVar47);
      iVar22 = (int)dVar47;
    }
    iVar34 = 1 - iVar22;
    if (0 < iVar22) {
      iVar34 = 0;
    }
    local_138 = (ImVec2 *)pow(10.0,(double)iVar34);
    dVar47 = floor((double)local_168 * (double)local_138 + 0.5);
    ImBufferWriter::Write((ImBufferWriter *)local_180,*pacVar42,dVar47 / (double)local_138);
    if ((plot->Flags & 0x100) != 0) {
      ImBufferWriter::Write((ImBufferWriter *)local_180,", (");
      pacVar42 = (GImPlot->NextPlotData).FmtY + 1;
      if ((GImPlot->NextPlotData).HasFmtY[1] == false) {
        pacVar42 = (char (*) [16])0x35aec5;
      }
      local_168 = (ImVec2 *)pIVar14->MousePos[1].y;
      if (pIVar14->YTicks[1].Size < 2) {
        pIVar28 = (ImPlotTick *)&plot->YAxis[1].Range;
        pIVar32 = (ImPlotTick *)&plot->YAxis[1].Range.Max;
      }
      else {
        if (pIVar14->YTicks[1].Ticks.Size < 2) goto LAB_001b8af4;
        pIVar28 = pIVar14->YTicks[1].Ticks.Data;
        pIVar32 = pIVar28 + 1;
      }
      dVar47 = (double)pIVar32->PlotPos - pIVar28->PlotPos;
      iVar22 = 0;
      if ((dVar47 != 0.0) || (NAN(dVar47))) {
        dVar47 = log10(ABS(dVar47));
        dVar47 = floor(dVar47);
        iVar22 = (int)dVar47;
      }
      iVar34 = 1 - iVar22;
      if (0 < iVar22) {
        iVar34 = 0;
      }
      local_138 = (ImVec2 *)pow(10.0,(double)iVar34);
      dVar47 = floor((double)local_168 * (double)local_138 + 0.5);
      ImBufferWriter::Write((ImBufferWriter *)local_180,*pacVar42,dVar47 / (double)local_138);
      ImBufferWriter::Write((ImBufferWriter *)local_180,")");
    }
    if ((plot->Flags & 0x200) != 0) {
      ImBufferWriter::Write((ImBufferWriter *)local_180,", (");
      pacVar42 = (char (*) [16])0x35aec5;
      if ((GImPlot->NextPlotData).HasFmtY[2] != false) {
        pacVar42 = (GImPlot->NextPlotData).FmtY + 2;
      }
      local_168 = (ImVec2 *)pIVar14->MousePos[2].y;
      if (pIVar14->YTicks[2].Size < 2) {
        pIVar28 = (ImPlotTick *)&plot->YAxis[2].Range;
        pIVar32 = (ImPlotTick *)&plot->YAxis[2].Range.Max;
      }
      else {
        if (pIVar14->YTicks[2].Ticks.Size < 2) {
LAB_001b8af4:
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                        ,0x68c,
                        "const T &ImVector<ImPlotTick>::operator[](int) const [T = ImPlotTick]");
        }
        pIVar28 = pIVar14->YTicks[2].Ticks.Data;
        pIVar32 = pIVar28 + 1;
      }
      dVar47 = (double)pIVar32->PlotPos - pIVar28->PlotPos;
      iVar22 = 0;
      if ((dVar47 != 0.0) || (NAN(dVar47))) {
        dVar47 = log10(ABS(dVar47));
        dVar47 = floor(dVar47);
        iVar22 = (int)dVar47;
      }
      iVar34 = 1 - iVar22;
      if (0 < iVar22) {
        iVar34 = 0;
      }
      local_138 = (ImVec2 *)pow(10.0,(double)iVar34);
      dVar47 = floor((double)local_168 * (double)local_138 + 0.5);
      ImBufferWriter::Write((ImBufferWriter *)local_180,*pacVar42,dVar47 / (double)local_138);
      ImBufferWriter::Write((ImBufferWriter *)local_180,")");
    }
    local_120 = ImGui::CalcTextSize((char *)&local_f8,(char *)0x0,false,-1.0);
    local_108 = GetLocationPos(pIVar38,&local_120,plot->MousePosLocation,
                               &(pIVar14->Style).MousePosPadding);
    fVar2 = (GImPlot->Style).Colors[0xc].w;
    if ((fVar2 != -1.0) || (NAN(fVar2))) {
      pIVar24 = (GImPlot->Style).Colors + 0xc;
      pIVar13 = (GImPlot->Style).Colors + 0xc;
    }
    else {
      pIVar24 = ImGui::GetStyleColorVec4(0);
      pIVar13 = pIVar24;
    }
    local_198._0_4_ = pIVar24->x;
    local_198._4_4_ = pIVar24->y;
    aIStack_190[0].x = pIVar13->z;
    aIStack_190[0].y = pIVar13->w;
    IVar20 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_198);
    ImDrawList::AddText(local_158,&local_108,IVar20,(char *)&local_f8,(char *)0x0);
  }
  ImGui::PopClipRect();
  plot->LegendHovered = false;
  uVar19 = (plot->Items).Buf.Size;
  uVar10 = (plot->Items).Map.Data.Size;
  if (uVar19 == uVar10) {
    uVar39 = 0;
    if (0 < (int)uVar19) {
      uVar39 = (ulong)uVar19;
    }
    lVar35 = 0;
    do {
      if (uVar39 * 0x10 + 0x10 == lVar35 + 0x10) {
        if (((plot->Flags & 2) == 0) && (0 < (plot->LegendData).Indices.Size)) {
          pIVar29 = &(pIVar14->Style).LegendInnerPadding;
          local_138 = &(pIVar14->Style).LegendSpacing;
          local_198 = (undefined1  [8])
                      CalcLegendSize(plot,pIVar29,local_138,plot->LegendOrientation);
          clip_rect_min = local_68;
          bVar18 = plot->LegendOutside;
          if (bVar18 != false) {
            pIVar38 = local_68;
          }
          IVar48 = GetLocationPos(pIVar38,(ImVec2 *)local_198,plot->LegendLocation,
                                  (ImVec2 *)
                                  ((long)&((ImVec2 *)((pIVar14->Style).Colors + -5))->x +
                                  (ulong)((bVar18 ^ 1) << 4)));
          pIVar38 = &plot->LegendRect;
          IVar46.y = IVar48.y + (float)local_198._4_4_;
          IVar46.x = (float)local_198._0_4_ + IVar48.x;
          (plot->LegendRect).Min = IVar48;
          (plot->LegendRect).Max = IVar46;
          if ((plot->FrameHovered != true) ||
             (fVar2 = (local_128->MousePos).x, fVar2 < (pIVar38->Min).x)) {
            bVar17 = false;
          }
          else {
            fVar6 = (local_128->MousePos).y;
            bVar17 = false;
            if (((plot->LegendRect).Min.y <= fVar6) && (fVar2 < (plot->LegendRect).Max.x)) {
              bVar17 = fVar6 < (plot->LegendRect).Max.y;
            }
          }
          plot->LegendHovered = bVar17;
          if (bVar18 == false) {
            PushPlotClipRect(0.0);
          }
          else {
            ImGui::PushClipRect(&clip_rect_min->Min,local_70,true);
          }
          fVar2 = (GImPlot->Style).Colors[8].w;
          if ((fVar2 != -1.0) || (NAN(fVar2))) {
            pIVar24 = (GImPlot->Style).Colors + 8;
            pIVar13 = (GImPlot->Style).Colors + 8;
          }
          else {
            pIVar24 = ImGui::GetStyleColorVec4(4);
            pIVar13 = pIVar24;
          }
          local_f8.x = pIVar24->x;
          local_f8.y = pIVar24->y;
          local_f8.z = pIVar13->z;
          local_f8.w = pIVar13->w;
          IVar20 = ImGui::ColorConvertFloat4ToU32(&local_f8);
          fVar2 = (GImPlot->Style).Colors[9].w;
          local_168 = pIVar29;
          if ((fVar2 != -1.0) || (NAN(fVar2))) {
            pIVar24 = (GImPlot->Style).Colors + 9;
            pfVar33 = &(GImPlot->Style).Colors[9].z;
          }
          else {
            fVar2 = (GImPlot->Style).Colors[7].w;
            if ((fVar2 != -1.0) || (NAN(fVar2))) {
              pIVar24 = (GImPlot->Style).Colors + 7;
              pfVar33 = &(GImPlot->Style).Colors[7].z;
            }
            else {
              pIVar24 = ImGui::GetStyleColorVec4(5);
              pfVar33 = &pIVar24->z;
            }
          }
          local_f8.x = pIVar24->x;
          local_f8.y = pIVar24->y;
          local_f8._8_8_ = *(undefined8 *)pfVar33;
          IVar21 = ImGui::ColorConvertFloat4ToU32(&local_f8);
          pIVar15 = local_158;
          pIVar29 = &(plot->LegendRect).Max;
          ImDrawList::AddRectFilled(local_158,&pIVar38->Min,pIVar29,IVar20,0.0,0);
          ImDrawList::AddRect(pIVar15,&pIVar38->Min,pIVar29,IVar21,0.0,0,1.0);
          ShowLegendEntries(plot,pIVar38,plot->LegendHovered,local_168,local_138,
                            plot->LegendOrientation,pIVar15);
          ImGui::PopClipRect();
          pIVar38 = local_118;
        }
        else {
          (plot->LegendRect).Min.x = 0.0;
          (plot->LegendRect).Min.y = 0.0;
          (plot->LegendRect).Max.x = 0.0;
          (plot->LegendRect).Max.y = 0.0;
        }
        if (plot->LegendFlipSideNextFrame == true) {
          plot->LegendOutside = (bool)(plot->LegendOutside ^ 1);
          plot->LegendFlipSideNextFrame = false;
        }
        if (0.0 < (pIVar14->Style).PlotBorderSize) {
          fVar2 = (GImPlot->Style).Colors[7].w;
          if ((fVar2 != -1.0) || (NAN(fVar2))) {
            pIVar24 = (GImPlot->Style).Colors + 7;
            pIVar13 = (GImPlot->Style).Colors + 7;
          }
          else {
            pIVar24 = ImGui::GetStyleColorVec4(5);
            pIVar13 = pIVar24;
          }
          local_f8.x = pIVar24->x;
          local_f8.y = pIVar24->y;
          local_f8.z = pIVar13->z;
          local_f8.w = pIVar13->w;
          IVar20 = ImGui::ColorConvertFloat4ToU32(&local_f8);
          ImDrawList::AddRect(local_158,&pIVar38->Min,local_60,IVar20,0.0,0xf0,
                              (pIVar14->Style).PlotBorderSize);
        }
        if ((pIVar14->FitThisFrame == true) &&
           ((0 < pIVar14->VisibleItemCount || (plot->Queried == true)))) {
          cVar37 = (char)plot->Flags;
          if (pIVar14->FitX == true) {
            dVar47 = (pIVar14->ExtentsX).Min;
            dVar4 = (pIVar14->ExtentsX).Max;
            dVar49 = (double)(pIVar14->Style).FitPadding.x * (dVar4 - dVar47) * 0.5;
            dVar47 = dVar47 - dVar49;
            (pIVar14->ExtentsX).Min = dVar47;
            dVar49 = dVar49 + dVar4;
            (pIVar14->ExtentsX).Max = dVar49;
            if ((plot->XAxis).Present == true) {
              if (((((plot->XAxis).HasRange != true) || ((plot->XAxis).RangeCond != 1)) &&
                  ((local_170->Flags & 0x800) == 0)) && ((long)ABS(dVar47) < 0x7ff0000000000000)) {
                (plot->XAxis).Range.Min = dVar47;
              }
              if ((((plot->XAxis).HasRange != true) || ((plot->XAxis).RangeCond != 1)) &&
                 (((local_170->Flags & 0x1000) == 0 && ((long)ABS(dVar49) < 0x7ff0000000000000)))) {
                (plot->XAxis).Range.Max = dVar49;
              }
            }
            dVar47 = (plot->XAxis).Range.Min;
            dVar4 = (plot->XAxis).Range.Max;
            if ((ABS(dVar4 - dVar47) < 2.2250738585072014e-308) ||
               (dVar49 = ABS(dVar4 + dVar47) * 2.220446049250313e-16,
               ABS(dVar4 - dVar47) < dVar49 + dVar49)) {
              (plot->XAxis).Range.Max = dVar4 + 0.5;
              (plot->XAxis).Range.Min = dVar47 + -0.5;
            }
            ImPlotAxis::Constrain(local_170);
            if ((cVar37 < '\0') && (pIVar14->FitY[0] == false)) {
              ImPlotAxis::SetAspect
                        (this,((plot->XAxis).Range.Max - (plot->XAxis).Range.Min) /
                              (double)(plot->XAxis).Pixels);
            }
          }
          pbVar36 = pIVar14->FitY;
          pdVar30 = &pIVar14->ExtentsY[0].Max;
          lVar35 = 0;
          do {
            if (*pbVar36 == true) {
              dVar47 = *pdVar30;
              dVar49 = (double)(pIVar14->Style).FitPadding.y *
                       (dVar47 - ((ImPlotRange *)(pdVar30 + -1))->Min) * 0.5;
              dVar4 = ((ImPlotRange *)(pdVar30 + -1))->Min - dVar49;
              ((ImPlotRange *)(pdVar30 + -1))->Min = dVar4;
              dVar49 = dVar49 + dVar47;
              *pdVar30 = dVar49;
              pIVar40 = (ImPlotAxis *)((long)&this->Flags + lVar35);
              if ((&pIVar11->YAxis[0].Present)[lVar35] == true) {
                if (((((&pIVar11->YAxis[0].HasRange)[lVar35] != true) ||
                     (*(int *)((long)&pIVar11->YAxis[0].RangeCond + lVar35) != 1)) &&
                    ((pIVar40->Flags & 0x800) == 0)) && ((long)ABS(dVar4) < 0x7ff0000000000000)) {
                  *(double *)((long)&pIVar11->YAxis[0].Range.Min + lVar35) = dVar4;
                }
                if ((((&pIVar11->YAxis[0].HasRange)[lVar35] != true) ||
                    (*(int *)((long)&pIVar11->YAxis[0].RangeCond + lVar35) != 1)) &&
                   (((pIVar40->Flags & 0x1000) == 0 && ((long)ABS(dVar49) < 0x7ff0000000000000)))) {
                  *(double *)((long)&pIVar11->YAxis[0].Range.Max + lVar35) = dVar49;
                }
              }
              dVar47 = *(double *)((long)&pIVar11->YAxis[0].Range.Min + lVar35);
              dVar4 = *(double *)((long)&pIVar11->YAxis[0].Range.Max + lVar35);
              dVar49 = ABS(dVar4 + dVar47) * 2.220446049250313e-16;
              if ((ABS(dVar4 - dVar47) < 2.2250738585072014e-308) ||
                 (ABS(dVar4 - dVar47) < dVar49 + dVar49)) {
                *(double *)((long)&pIVar11->YAxis[0].Range.Max + lVar35) = dVar4 + 0.5;
                *(double *)((long)&pIVar11->YAxis[0].Range.Min + lVar35) = dVar47 + -0.5;
              }
              ImPlotAxis::Constrain(pIVar40);
              if ((lVar35 == 0 && cVar37 < '\0') && (pIVar14->FitX == false)) {
                ImPlotAxis::SetAspect
                          (local_170,
                           (local_140->YAxis[0].Range.Max - local_140->YAxis[0].Range.Min) /
                           (double)local_140->YAxis[0].Pixels);
              }
            }
            plot = local_140;
            lVar35 = lVar35 + 0x80;
            pdVar30 = pdVar30 + 2;
            pbVar36 = pbVar36 + 1;
          } while (lVar35 != 0x180);
          if (((cVar37 < '\0') && (pIVar14->FitX == true)) && (pIVar14->FitY[0] == true)) {
            dVar4 = ((local_140->XAxis).Range.Max - (local_140->XAxis).Range.Min) /
                    (double)(local_140->XAxis).Pixels;
            dVar47 = (local_140->YAxis[0].Range.Max - local_140->YAxis[0].Range.Min) /
                     (double)local_140->YAxis[0].Pixels;
            uVar39 = -(ulong)(dVar47 <= dVar4);
            local_158 = (ImDrawList *)(~uVar39 & (ulong)dVar47 | (ulong)dVar4 & uVar39);
            uStack_150 = 0;
            ImPlotAxis::SetAspect(local_170,(double)local_158);
            ImPlotAxis::SetAspect(this,(double)local_158);
          }
        }
        if ((((plot->Flags & 4) == 0) && (plot->PlotHovered == true)) &&
           ((local_128->MouseReleased[(pIVar14->InputMap).ContextMenuButton] == true &&
            ((plot->LegendHovered == false && (plot->ContextLocked == false)))))) {
          ImGui::OpenPopup("##PlotContext",0);
        }
        bVar18 = ImGui::BeginPopup("##PlotContext",0);
        if (bVar18) {
          ShowPlotContextMenu(plot);
          ImGui::EndPopup();
        }
        if ((((((plot->Flags & 4) == 0) && (plot->FrameHovered == true)) &&
             ((plot->XAxis).ExtHovered == true)) &&
            ((local_128->MouseReleased[(pIVar14->InputMap).ContextMenuButton] == true &&
             (plot->LegendHovered == false)))) && (plot->ContextLocked == false)) {
          ImGui::OpenPopup("##XContext",0);
        }
        bVar18 = ImGui::BeginPopup("##XContext",0);
        if (bVar18) {
          ImGui::Text("X-Axis");
          ImGui::Separator();
          pIVar40 = (ImPlotAxis *)0x0;
          if ((char)plot->Flags < '\0') {
            pIVar40 = this;
          }
          ShowAxisContextMenu(local_170,pIVar40,true);
          ImGui::EndPopup();
        }
        lVar35 = 0;
        do {
          ImGui::PushID((int)lVar35);
          if ((((plot->Flags & 4) == 0) && (plot->FrameHovered == true)) &&
             ((this->ExtHovered == true &&
              (((local_128->MouseReleased[(pIVar14->InputMap).ContextMenuButton] == true &&
                (plot->LegendHovered == false)) && (plot->ContextLocked == false)))))) {
            ImGui::OpenPopup("##YContext",0);
          }
          bVar18 = ImGui::BeginPopup("##YContext",0);
          if (bVar18) {
            if (lVar35 == 0) {
              ImGui::Text("Y-Axis");
            }
            else {
              ImGui::Text("Y-Axis %d");
            }
            ImGui::Separator();
            if ((lVar35 != 0) || (pIVar40 = local_170, (plot->Flags & 0x80) == 0)) {
              pIVar40 = (ImPlotAxis *)0x0;
            }
            ShowAxisContextMenu(this,pIVar40,false);
            ImGui::EndPopup();
          }
          ImGui::PopID();
          lVar35 = lVar35 + 1;
          this = this + 1;
        } while (lVar35 != 3);
        pdVar30 = (plot->XAxis).LinkedMin;
        if (pdVar30 != (double *)0x0) {
          *pdVar30 = (plot->XAxis).Range.Min;
        }
        pdVar30 = (plot->XAxis).LinkedMax;
        if (pdVar30 != (double *)0x0) {
          *pdVar30 = (plot->XAxis).Range.Max;
        }
        lVar35 = 0;
        do {
          puVar12 = *(undefined8 **)((long)&plot->YAxis[0].LinkedMin + lVar35);
          if (puVar12 != (undefined8 *)0x0) {
            *puVar12 = *(undefined8 *)((long)&plot->YAxis[0].Range.Min + lVar35);
          }
          puVar12 = *(undefined8 **)((long)&plot->YAxis[0].LinkedMax + lVar35);
          if (puVar12 != (undefined8 *)0x0) {
            *puVar12 = *(undefined8 *)((long)&plot->YAxis[0].Range.Max + lVar35);
          }
          lVar35 = lVar35 + 0x80;
        } while (lVar35 != 0x180);
        if ((plot->ContextLocked != false) &&
           (local_128->MouseReleased[(pIVar14->InputMap).BoxSelectButton] == true)) {
          plot->ContextLocked = false;
        }
        uVar19 = (plot->Items).Buf.Size;
        uVar10 = (plot->Items).Map.Data.Size;
        if (uVar19 == uVar10) {
          uVar39 = 0;
          if (0 < (int)uVar19) {
            uVar39 = (ulong)uVar19;
          }
          lVar35 = 0;
          do {
            if (uVar39 * 0x10 + 0x10 == lVar35 + 0x10) {
              plot->Initialized = true;
              ImGui::PopID();
              Reset(GImPlot);
              return;
            }
            (&((plot->Items).Buf.Data)->SeenThisFrame)[lVar35] = false;
            lVar35 = lVar35 + 0x10;
          } while (uVar19 == uVar10);
        }
        break;
      }
      (&((plot->Items).Buf.Data)->LegendHovered)[lVar35] = false;
      lVar35 = lVar35 + 0x10;
    } while (uVar19 == uVar10);
  }
  __assert_fail("Buf.Size == Map.Data.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_internal.h"
                ,0x279,"int ImPool<ImPlotItem>::GetBufSize() const [T = ImPlotItem]");
LAB_001b8a80:
  pcVar25 = "T &ImVector<ImPlotTick>::operator[](int) [T = ImPlotTick]";
LAB_001b8a95:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x68b,pcVar25);
}

Assistant:

void EndPlot() {
    IM_ASSERT_USER_ERROR(GImPlot != NULL, "No current context. Did you call ImPlot::CreateContext() or ImPlot::SetCurrentContext()?");
    ImPlotContext& gp     = *GImPlot;
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "Mismatched BeginPlot()/EndPlot()!");
    ImGuiContext &G       = *GImGui;
    ImPlotPlot &plot     = *gp.CurrentPlot;
    ImGuiWindow * Window  = G.CurrentWindow;
    ImDrawList & DrawList = *Window->DrawList;
    const ImGuiIO &   IO  = ImGui::GetIO();

    // AXIS STATES ------------------------------------------------------------

    const bool any_y_dragging = plot.YAxis[0].Dragging || plot.YAxis[1].Dragging || plot.YAxis[2].Dragging;

    // FINAL RENDER -----------------------------------------------------------

    // render grid (foreground)
    PushPlotClipRect(gp.Style.PlotBorderSize == 0 ? 1.0f : 0.0f);
    if (!ImHasFlag(plot.XAxis.Flags, ImPlotAxisFlags_NoGridLines) && ImHasFlag(plot.XAxis.Flags, ImPlotAxisFlags_Foreground))
        RenderGridLinesX(DrawList, gp.XTicks, plot.PlotRect, plot.XAxis.ColorMaj, plot.XAxis.ColorMaj, gp.Style.MajorGridSize.x, gp.Style.MinorGridSize.x);
    for (int i = 0; i < IMPLOT_Y_AXES; i++) {
        if (plot.YAxis[i].Present && !ImHasFlag(plot.YAxis[i].Flags, ImPlotAxisFlags_NoGridLines) && ImHasFlag(plot.YAxis[i].Flags, ImPlotAxisFlags_Foreground))
            RenderGridLinesY(DrawList, gp.YTicks[i], plot.PlotRect,  plot.YAxis[i].ColorMaj,  plot.YAxis[i].ColorMin, gp.Style.MajorGridSize.y, gp.Style.MinorGridSize.y);
    }
    PopPlotClipRect();

    // render x-ticks
    PushPlotClipRect();
    if (!ImHasFlag(plot.XAxis.Flags, ImPlotAxisFlags_NoTickMarks)) {
        for (int t = 0; t < gp.XTicks.Size; t++) {
            ImPlotTick *xt = &gp.XTicks.Ticks[t];
            if (xt->Level == 0)
                DrawList.AddLine(ImVec2(xt->PixelPos, plot.PlotRect.Max.y),
                                ImVec2(xt->PixelPos, plot.PlotRect.Max.y - (xt->Major ? gp.Style.MajorTickLen.x : gp.Style.MinorTickLen.x)),
                                plot.XAxis.ColorMaj,
                                xt->Major ? gp.Style.MajorTickSize.x : gp.Style.MinorTickSize.x);
        }
    }
    PopPlotClipRect();

    // render y-ticks
    ImGui::PushClipRect(plot.PlotRect.Min, ImVec2(plot.FrameRect.Max.x, plot.PlotRect.Max.y), true);
    int axis_count = 0;
    for (int i = 0; i < IMPLOT_Y_AXES; i++) {
        if (!plot.YAxis[i].Present) { continue; }
        axis_count++;
        float x_start = gp.YAxisReference[i];
        if (!ImHasFlag(plot.YAxis[i].Flags, ImPlotAxisFlags_NoTickMarks)) {
            float direction = (i == 0) ? 1.0f : -1.0f;
            bool no_major = axis_count >= 3;
            for (int t = 0; t < gp.YTicks[i].Size; t++) {
                ImPlotTick *yt = &gp.YTicks[i].Ticks[t];
                ImVec2 start = ImVec2(x_start, yt->PixelPos);
                DrawList.AddLine(start,
                                 start + ImVec2(direction * ((!no_major && yt->Major) ? gp.Style.MajorTickLen.y : gp.Style.MinorTickLen.y), 0),
                                 plot.YAxis[i].ColorMaj,
                                 (!no_major && yt->Major) ? gp.Style.MajorTickSize.y : gp.Style.MinorTickSize.y);
            }
        }
        if (axis_count >= 3) {
            // Draw a bar next to the ticks to act as a visual separator.
            DrawList.AddLine(ImVec2(x_start, plot.PlotRect.Min.y), ImVec2(x_start, plot.PlotRect.Max.y), GetStyleColorU32(ImPlotCol_YAxisGrid3), 1);
        }
    }
    ImGui::PopClipRect();

    // render annotations
    PushPlotClipRect();
    for (int i = 0; i < gp.Annotations.Size; ++i) {
        const char* txt       = gp.Annotations.GetText(i);
        ImPlotAnnotation& an  = gp.Annotations.Annotations[i];
        const ImVec2 txt_size = ImGui::CalcTextSize(txt);
        const ImVec2 size     = txt_size + gp.Style.AnnotationPadding * 2;
        ImVec2 pos            = an.Pos;
        if (an.Offset.x == 0)
            pos.x -= size.x / 2;
        else if (an.Offset.x > 0)
            pos.x += an.Offset.x;
        else
            pos.x -= size.x - an.Offset.x;
        if (an.Offset.y == 0)
            pos.y -= size.y / 2;
        else if (an.Offset.y > 0)
            pos.y += an.Offset.y;
        else
            pos.y -= size.y - an.Offset.y;
        if (an.Clamp)
            pos = ClampLabelPos(pos, size, plot.PlotRect.Min, plot.PlotRect.Max);
        ImRect rect(pos,pos+size);
        if (an.Offset.x != 0 || an.Offset.y != 0) {
            ImVec2 corners[4] = {rect.GetTL(), rect.GetTR(), rect.GetBR(), rect.GetBL()};
            int min_corner = 0;
            float min_len = FLT_MAX;
            for (int c = 0; c < 4; ++c) {
                float len = ImLengthSqr(an.Pos - corners[c]);
                if (len < min_len) {
                    min_corner = c;
                    min_len = len;
                }
            }
            DrawList.AddLine(an.Pos, corners[min_corner], an.ColorBg);
        }
        DrawList.AddRectFilled(rect.Min, rect.Max, an.ColorBg);
        DrawList.AddText(pos + gp.Style.AnnotationPadding, an.ColorFg, txt);
    }

    // render selection
    if (plot.Selected)
        RenderSelectionRect(DrawList, plot.SelectRect.Min + plot.PlotRect.Min, plot.SelectRect.Max + plot.PlotRect.Min, GetStyleColorVec4(ImPlotCol_Selection));
    // render query
    if (plot.Queried)
        RenderSelectionRect(DrawList, plot.QueryRect.Min + plot.PlotRect.Min, plot.QueryRect.Max + plot.PlotRect.Min, GetStyleColorVec4(ImPlotCol_Query));

    // render crosshairs
    if (ImHasFlag(plot.Flags, ImPlotFlags_Crosshairs) && plot.PlotHovered && !(plot.XAxis.Dragging || any_y_dragging) && !plot.Selecting && !plot.Querying && !plot.LegendHovered) {
        ImGui::SetMouseCursor(ImGuiMouseCursor_None);
        ImVec2 xy = IO.MousePos;
        ImVec2 h1(plot.PlotRect.Min.x, xy.y);
        ImVec2 h2(xy.x - 5, xy.y);
        ImVec2 h3(xy.x + 5, xy.y);
        ImVec2 h4(plot.PlotRect.Max.x, xy.y);
        ImVec2 v1(xy.x, plot.PlotRect.Min.y);
        ImVec2 v2(xy.x, xy.y - 5);
        ImVec2 v3(xy.x, xy.y + 5);
        ImVec2 v4(xy.x, plot.PlotRect.Max.y);
        ImU32 col = GetStyleColorU32(ImPlotCol_Crosshairs);
        DrawList.AddLine(h1, h2, col);
        DrawList.AddLine(h3, h4, col);
        DrawList.AddLine(v1, v2, col);
        DrawList.AddLine(v3, v4, col);
    }

    // render mouse pos
    if (!ImHasFlag(plot.Flags, ImPlotFlags_NoMousePos) && plot.PlotHovered) {
        char buffer[128] = {};
        ImBufferWriter writer(buffer, sizeof(buffer));
        // x
        if (ImHasFlag(plot.XAxis.Flags, ImPlotAxisFlags_Time)) {
            ImPlotTimeUnit unit = GetUnitForRange(plot.XAxis.Range.Size() / (plot.PlotRect.GetWidth() / 100));
            const int written = FormatDateTime(ImPlotTime::FromDouble(gp.MousePos[0].x), &writer.Buffer[writer.Pos], writer.Size - writer.Pos - 1, GetDateTimeFmt(TimeFormatMouseCursor, unit));
            if (written > 0)
                writer.Pos += ImMin(written, writer.Size - writer.Pos - 1);
        }
        else {
            writer.Write(GetFormatX(), RoundAxisValue(plot.XAxis, gp.XTicks, gp.MousePos[0].x));
        }
        // y1
        writer.Write(", ");
        writer.Write(GetFormatY(0), RoundAxisValue(plot.YAxis[0], gp.YTicks[0], gp.MousePos[0].y));
        // y2
        if (ImHasFlag(plot.Flags, ImPlotFlags_YAxis2)) {
            writer.Write(", (");
            writer.Write(GetFormatY(1), RoundAxisValue(plot.YAxis[1], gp.YTicks[1], gp.MousePos[1].y));
            writer.Write(")");
        }
        // y3
        if (ImHasFlag(plot.Flags, ImPlotFlags_YAxis3)) {
            writer.Write(", (");
            writer.Write(GetFormatY(2), RoundAxisValue(plot.YAxis[2], gp.YTicks[2], gp.MousePos[2].y));
            writer.Write(")");
        }
        const ImVec2 size = ImGui::CalcTextSize(buffer);
        const ImVec2 pos = GetLocationPos(plot.PlotRect, size, plot.MousePosLocation, gp.Style.MousePosPadding);
        DrawList.AddText(pos, GetStyleColorU32(ImPlotCol_InlayText), buffer);
    }
    PopPlotClipRect();

    // reset legend hovers
    plot.LegendHovered = false;
    for (int i = 0; i < plot.Items.GetBufSize(); ++i)
        plot.Items.GetByIndex(i)->LegendHovered = false;
    // render legend
    if (!ImHasFlag(plot.Flags, ImPlotFlags_NoLegend) && plot.GetLegendCount() > 0) {
        const ImVec2 legend_size = CalcLegendSize(plot, gp.Style.LegendInnerPadding, gp.Style.LegendSpacing, plot.LegendOrientation);
        const ImVec2 legend_pos  = GetLocationPos(plot.LegendOutside ? plot.FrameRect : plot.PlotRect,
                                                  legend_size,
                                                  plot.LegendLocation,
                                                  plot.LegendOutside ? gp.Style.PlotPadding : gp.Style.LegendPadding);
        plot.LegendRect = ImRect(legend_pos, legend_pos + legend_size);
        // test hover
        plot.LegendHovered = plot.FrameHovered && plot.LegendRect.Contains(IO.MousePos);

        if (plot.LegendOutside)
            ImGui::PushClipRect(plot.FrameRect.Min, plot.FrameRect.Max, true);
        else
            PushPlotClipRect();
        ImU32  col_bg      = GetStyleColorU32(ImPlotCol_LegendBg);
        ImU32  col_bd      = GetStyleColorU32(ImPlotCol_LegendBorder);
        DrawList.AddRectFilled(plot.LegendRect.Min, plot.LegendRect.Max, col_bg);
        DrawList.AddRect(plot.LegendRect.Min, plot.LegendRect.Max, col_bd);
        ShowLegendEntries(plot, plot.LegendRect, plot.LegendHovered, gp.Style.LegendInnerPadding, gp.Style.LegendSpacing, plot.LegendOrientation, DrawList);
        ImGui::PopClipRect();
    }
    else {
        plot.LegendRect = ImRect();
    }
    if (plot.LegendFlipSideNextFrame)  {
        plot.LegendOutside  = !plot.LegendOutside;
        plot.LegendFlipSideNextFrame = false;
    }

    // render border
    if (gp.Style.PlotBorderSize > 0)
        DrawList.AddRect(plot.PlotRect.Min, plot.PlotRect.Max, GetStyleColorU32(ImPlotCol_PlotBorder), 0, ImDrawFlags_RoundCornersAll, gp.Style.PlotBorderSize);

    // FIT DATA --------------------------------------------------------------
    const bool axis_equal = ImHasFlag(plot.Flags, ImPlotFlags_Equal);
    if (gp.FitThisFrame && (gp.VisibleItemCount > 0 || plot.Queried)) {
        if (gp.FitX) {
            const double ext_size = gp.ExtentsX.Size() * 0.5;
            gp.ExtentsX.Min -= ext_size * gp.Style.FitPadding.x;
            gp.ExtentsX.Max += ext_size * gp.Style.FitPadding.x;
            if (!plot.XAxis.IsLockedMin() && !ImNanOrInf(gp.ExtentsX.Min))
                plot.XAxis.Range.Min = (gp.ExtentsX.Min);
            if (!plot.XAxis.IsLockedMax() && !ImNanOrInf(gp.ExtentsX.Max))
                plot.XAxis.Range.Max = (gp.ExtentsX.Max);
            if (ImAlmostEqual(plot.XAxis.Range.Max, plot.XAxis.Range.Min))  {
                plot.XAxis.Range.Max += 0.5;
                plot.XAxis.Range.Min -= 0.5;
            }
            plot.XAxis.Constrain();
            if (axis_equal && !gp.FitY[0])
                plot.YAxis[0].SetAspect(plot.XAxis.GetAspect());
        }
        for (int i = 0; i < IMPLOT_Y_AXES; i++) {
            if (gp.FitY[i]) {
                const double ext_size = gp.ExtentsY[i].Size() * 0.5;
                gp.ExtentsY[i].Min -= ext_size * gp.Style.FitPadding.y;
                gp.ExtentsY[i].Max += ext_size * gp.Style.FitPadding.y;
                if (!plot.YAxis[i].IsLockedMin() && !ImNanOrInf(gp.ExtentsY[i].Min))
                    plot.YAxis[i].Range.Min = (gp.ExtentsY[i].Min);
                if (!plot.YAxis[i].IsLockedMax() && !ImNanOrInf(gp.ExtentsY[i].Max))
                    plot.YAxis[i].Range.Max = (gp.ExtentsY[i].Max);
                if (ImAlmostEqual(plot.YAxis[i].Range.Max, plot.YAxis[i].Range.Min)) {
                    plot.YAxis[i].Range.Max += 0.5;
                    plot.YAxis[i].Range.Min -= 0.5;
                }
                plot.YAxis[i].Constrain();
                if (i == 0 && axis_equal && !gp.FitX)
                    plot.XAxis.SetAspect(plot.YAxis[0].GetAspect());
            }
        }
        if (axis_equal && gp.FitX && gp.FitY[0]) {
            double aspect = ImMax(plot.XAxis.GetAspect(), plot.YAxis[0].GetAspect());
            plot.XAxis.SetAspect(aspect);
            plot.YAxis[0].SetAspect(aspect);
        }
    }

    // CONTEXT MENUS -----------------------------------------------------------

    // main ctx menu
    if (!ImHasFlag(plot.Flags, ImPlotFlags_NoMenus) && plot.PlotHovered && IO.MouseReleased[gp.InputMap.ContextMenuButton] && !plot.LegendHovered && !plot.ContextLocked)
        ImGui::OpenPopup("##PlotContext");
    if (ImGui::BeginPopup("##PlotContext")) {
        ShowPlotContextMenu(plot);
        ImGui::EndPopup();
    }

    // x-axis ctx menu
    if (!ImHasFlag(plot.Flags, ImPlotFlags_NoMenus) && plot.FrameHovered && plot.XAxis.ExtHovered && IO.MouseReleased[gp.InputMap.ContextMenuButton] && !plot.LegendHovered && !plot.ContextLocked)
        ImGui::OpenPopup("##XContext");
    if (ImGui::BeginPopup("##XContext")) {
        ImGui::Text("X-Axis"); ImGui::Separator();
        ShowAxisContextMenu(plot.XAxis, ImHasFlag(plot.Flags, ImPlotFlags_Equal) ? &plot.YAxis[0] : NULL, true);
        ImGui::EndPopup();
    }

    // y-axes ctx menus
    for (int i = 0; i < IMPLOT_Y_AXES; ++i) {
        ImGui::PushID(i);
        if (!ImHasFlag(plot.Flags, ImPlotFlags_NoMenus) && plot.FrameHovered && plot.YAxis[i].ExtHovered && IO.MouseReleased[gp.InputMap.ContextMenuButton] && !plot.LegendHovered && !plot.ContextLocked)
            ImGui::OpenPopup("##YContext");
        if (ImGui::BeginPopup("##YContext")) {
            if (i == 0) {
                ImGui::Text("Y-Axis"); ImGui::Separator();
            }
            else {
                ImGui::Text("Y-Axis %d", i + 1); ImGui::Separator();
            }
            ShowAxisContextMenu(plot.YAxis[i], (i == 0 && ImHasFlag(plot.Flags, ImPlotFlags_Equal)) ? &plot.XAxis : NULL, false);
            ImGui::EndPopup();
        }
        ImGui::PopID();
    }


    // LINKED AXES ------------------------------------------------------------

    PushLinkedAxis(plot.XAxis);
    for (int i = 0; i < IMPLOT_Y_AXES; ++i)
        PushLinkedAxis(plot.YAxis[i]);

    // CLEANUP ----------------------------------------------------------------

    // resset context locked flag
    if (plot.ContextLocked && IO.MouseReleased[gp.InputMap.BoxSelectButton])
        plot.ContextLocked = false;


    // reset the plot items for the next frame
    for (int i = 0; i < plot.Items.GetBufSize(); ++i) {
        plot.Items.GetByIndex(i)->SeenThisFrame = false;
    }

    // mark the plot as initialized, i.e. having made it through one frame completely
    plot.Initialized = true;

    // Pop ImGui::PushID at the end of BeginPlot
    ImGui::PopID();
    // Reset context for next plot
    Reset(GImPlot);
}